

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall kj::Maybe<kj::OwnFd>::~Maybe(Maybe<kj::OwnFd> *this)

{
  Maybe<kj::OwnFd> *this_local;
  
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&this->ptr);
  return;
}

Assistant:

class Maybe {
  // A T, or nullptr.

  // IF YOU CHANGE THIS CLASS:  Note that there is a specialization of it in memory.h.

public:
  Maybe(): ptr(nullptr) {}
  Maybe(T&& t): ptr(kj::mv(t)) {}
  Maybe(T& t): ptr(t) {}
  Maybe(const T& t): ptr(t) {}
  Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }
  Maybe(const Maybe& other): ptr(other.ptr) {}
  Maybe(Maybe& other): ptr(other.ptr) {}

  template <typename U>
  Maybe(Maybe<U>&& other) {
    KJ_IF_SOME(val, kj::mv(other)) {
      ptr.emplace(kj::mv(val));
      other = kj::none;
    }
  }
  template <typename U>
  Maybe(Maybe<U&>&& other) {
    KJ_IF_SOME(val, other) {
      ptr.emplace(val);
      other = kj::none;
    }
  }
  template <typename U>
  Maybe(const Maybe<U>& other) {
    KJ_IF_SOME(val, other) {
      ptr.emplace(val);
    }
  }

  KJ_DEPRECATE_EMPTY_MAYBE_FROM_NULLPTR_ATTR
  Maybe(decltype(nullptr)): ptr(nullptr) {}

  Maybe(kj::None): ptr(nullptr) {}

  template <typename... Params>
  inline T& emplace(Params&&... params) {
    // Replace this Maybe's content with a new value constructed by passing the given parameters to
    // T's constructor. This can be used to initialize a Maybe without copying or even moving a T.
    // Returns a reference to the newly-constructed value.

    return ptr.emplace(kj::fwd<Params>(params)...);
  }

  inline Maybe& operator=(T&& other) { ptr = kj::mv(other); return *this; }
  inline Maybe& operator=(T& other) { ptr = other; return *this; }
  inline Maybe& operator=(const T& other) { ptr = other; return *this; }

  inline Maybe& operator=(Maybe&& other) { ptr = kj::mv(other.ptr); other = kj::none; return *this; }
  inline Maybe& operator=(Maybe& other) { ptr = other.ptr; return *this; }
  inline Maybe& operator=(const Maybe& other) { ptr = other.ptr; return *this; }

  template <typename U>
  Maybe& operator=(Maybe<U>&& other) {
    KJ_IF_SOME(val, kj::mv(other)) {
      ptr.emplace(kj::mv(val));
      other = kj::none;
    } else {
      ptr = nullptr;
    }
    return *this;
  }
  template <typename U>
  Maybe& operator=(const Maybe<U>& other) {
    KJ_IF_SOME(val, other) {
      ptr.emplace(val);
    } else {
      ptr = nullptr;
    }